

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_19(QPDF *pdf,char *arg2)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  allocator<char> local_f1;
  string local_f0 [32];
  QPDFObjectHandle local_d0;
  QPDFObjGen local_bc;
  allocator<char> local_b1;
  string local_b0 [32];
  QPDFObjectHandle local_90;
  QPDFObjGen local_80;
  QPDFObjGen local_78;
  QPDFObjGen local_70;
  undefined1 local_68 [8];
  value_type last;
  QPDFObjectHandle local_48;
  size_type local_38;
  size_t count;
  value_type newpage;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages;
  char *arg2_local;
  QPDF *pdf_local;
  
  newpage.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QPDF::getAllPages();
  pvVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                      newpage.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,5
                     );
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&count,pvVar2);
  local_38 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                        newpage.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       );
  QPDFObjectHandle::QPDFObjectHandle(&local_48,(QPDFObjectHandle *)&count);
  QPDF::addPage((QPDFObjectHandle *)pdf,SUB81(&local_48,0));
  QPDFObjectHandle::~QPDFObjectHandle(&local_48);
  pvVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::back
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                      newpage.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_68,pvVar2);
  sVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     newpage.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  if (sVar3 != local_38 + 1) {
    __assert_fail("pages.size() == count + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x33a,"void test_19(QPDF &, const char *)");
  }
  local_70 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  local_78 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar1 = QPDFObjGen::operator==(&local_70,&local_78);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(last.getObjGen() == newpage.getObjGen())",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x33b,"void test_19(QPDF &, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"/Contents",&local_b1);
  QPDFObjectHandle::getKey((string *)&local_90);
  local_80 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"/Contents",&local_f1);
  QPDFObjectHandle::getKey((string *)&local_d0);
  local_bc = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar1 = QPDFObjGen::operator==(&local_80,&local_bc);
  if (!bVar1) {
    __assert_fail("last.getKey(\"/Contents\").getObjGen() == newpage.getKey(\"/Contents\").getObjGen()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x33c,"void test_19(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&count);
  return;
}

Assistant:

static void
test_19(QPDF& pdf, char const* arg2)
{
    // Remove a page and re-insert it in the same file.
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();

    // Try to insert a page that's already there. A shallow copy
    // gets inserted instead.
    auto newpage = pages.at(5);
    size_t count = pages.size();
    pdf.addPage(newpage, false);
    auto last = pages.back();
    assert(pages.size() == count + 1);
    assert(!(last.getObjGen() == newpage.getObjGen()));
    assert(last.getKey("/Contents").getObjGen() == newpage.getKey("/Contents").getObjGen());
}